

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t * archive_acl_text_w(archive *a,archive_acl *acl,wchar_t flags)

{
  size_t sVar1;
  int *piVar2;
  wchar_t **wp_00;
  int *piVar3;
  undefined4 *puVar4;
  uint in_EDX;
  wchar_t **ppwVar5;
  long in_RSI;
  wchar_t *wp;
  wchar_t r;
  wchar_t id;
  archive_acl_entry *ap;
  wchar_t separator;
  wchar_t *prefix;
  wchar_t *wname;
  size_t length;
  wchar_t count;
  wchar_t **in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  archive *paVar6;
  wchar_t tag;
  wchar_t *in_stack_ffffffffffffffc8;
  wchar_t **in_stack_ffffffffffffffd0;
  long local_28;
  int local_20;
  wchar_t *local_8;
  
  if (*(long *)(in_RSI + 0x20) != 0) {
    free(*(void **)(in_RSI + 0x20));
    *(undefined8 *)(in_RSI + 0x20) = 0;
  }
  tag = L',';
  local_20 = 0;
  local_28 = 0;
  paVar6 = *(archive **)(in_RSI + 8);
  do {
    if (paVar6 == (archive *)0x0) {
      if ((0 < local_20) && ((in_EDX & 0x100) != 0)) {
        local_28 = local_28 + 0x20;
      }
      if (local_20 == 0) {
        local_8 = (wchar_t *)0x0;
      }
      else {
        wp_00 = (wchar_t **)malloc(local_28 << 2);
        *(wchar_t ***)(in_RSI + 0x20) = wp_00;
        if (wp_00 == (wchar_t **)0x0) {
          local_8 = (wchar_t *)0x0;
        }
        else {
          if ((in_EDX & 0x100) != 0) {
            append_entry_w(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,tag,(wchar_t *)paVar6
                           ,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
            puVar4 = (undefined4 *)((long)wp_00 + 4);
            *(undefined4 *)wp_00 = 0x2c;
            append_entry_w(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,tag,(wchar_t *)paVar6
                           ,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
            wp_00 = (wchar_t **)(puVar4 + 1);
            *puVar4 = 0x2c;
            append_entry_w(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,tag,(wchar_t *)paVar6
                           ,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
            for (paVar6 = *(archive **)(in_RSI + 8); paVar6 != (archive *)0x0;
                paVar6 = *(archive **)paVar6) {
              if (((ulong)paVar6->vtable & 0x100) != 0) {
                in_stack_ffffffffffffffb0 =
                     archive_mstring_get_wcs
                               (paVar6,(archive_mstring *)
                                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                ,wp_00);
                if (in_stack_ffffffffffffffb0 == L'\0') {
                  ppwVar5 = (wchar_t **)((long)wp_00 + 4);
                  *(wchar_t *)wp_00 = tag;
                  if ((in_EDX & 0x400) == 0) {
                    in_stack_ffffffffffffffb4 = L'\xffffffff';
                  }
                  else {
                    in_stack_ffffffffffffffb4 = *(wchar_t *)&paVar6->field_0x14;
                  }
                  append_entry_w(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,tag,
                                 (wchar_t *)paVar6,in_stack_ffffffffffffffb4,L'\0');
                  wp_00 = ppwVar5;
                }
                else if ((in_stack_ffffffffffffffb0 < L'\0') &&
                        (piVar2 = __errno_location(), *piVar2 == 0xc)) {
                  return (wchar_t *)0x0;
                }
              }
            }
          }
          if ((in_EDX & 0x200) != 0) {
            if ((in_EDX & 0x800) == 0) {
              piVar2 = (wchar_t *)0x0;
            }
            else {
              piVar2 = anon_var_dwarf_4086a;
            }
            paVar6 = *(archive **)(in_RSI + 8);
            local_20 = 0;
            for (; paVar6 != (archive *)0x0; paVar6 = *(archive **)paVar6) {
              if (((ulong)paVar6->vtable & 0x200) != 0) {
                in_stack_ffffffffffffffb0 =
                     archive_mstring_get_wcs
                               (paVar6,(archive_mstring *)
                                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                ,wp_00);
                if (in_stack_ffffffffffffffb0 == L'\0') {
                  ppwVar5 = wp_00;
                  if (0 < local_20) {
                    ppwVar5 = (wchar_t **)((long)wp_00 + 4);
                    *(wchar_t *)wp_00 = tag;
                  }
                  if ((in_EDX & 0x400) == 0) {
                    in_stack_ffffffffffffffb4 = L'\xffffffff';
                  }
                  else {
                    in_stack_ffffffffffffffb4 = *(wchar_t *)&paVar6->field_0x14;
                  }
                  append_entry_w(in_stack_ffffffffffffffd0,piVar2,tag,(wchar_t *)paVar6,
                                 in_stack_ffffffffffffffb4,L'\0');
                  local_20 = local_20 + 1;
                  wp_00 = ppwVar5;
                }
                else if ((in_stack_ffffffffffffffb0 < L'\0') &&
                        (piVar3 = __errno_location(), *piVar3 == 0xc)) {
                  return (wchar_t *)0x0;
                }
              }
            }
          }
          local_8 = *(wchar_t **)(in_RSI + 0x20);
        }
      }
      return local_8;
    }
    if ((*(uint *)&paVar6->vtable & in_EDX) != 0) {
      local_20 = local_20 + 1;
      if (((in_EDX & 0x800) != 0) && (((ulong)paVar6->vtable & 0x200) != 0)) {
        local_28 = local_28 + 8;
      }
      in_stack_ffffffffffffffb0 =
           archive_mstring_get_wcs
                     (paVar6,(archive_mstring *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
      if ((in_stack_ffffffffffffffb0 == L'\0') && (in_stack_ffffffffffffffd0 != (wchar_t **)0x0)) {
        sVar1 = wcslen((wchar_t *)in_stack_ffffffffffffffd0);
        local_28 = sVar1 + local_28 + 6;
      }
      else {
        if ((in_stack_ffffffffffffffb0 < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
          return (wchar_t *)0x0;
        }
        local_28 = local_28 + 0x13;
      }
      local_28 = local_28 + 0x13;
    }
    paVar6 = *(archive **)paVar6;
  } while( true );
}

Assistant:

const wchar_t *
archive_acl_text_w(struct archive *a, struct archive_acl *acl, int flags)
{
	int count;
	size_t length;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r;
	wchar_t *wp;

	if (acl->acl_text_w != NULL) {
		free (acl->acl_text_w);
		acl->acl_text_w = NULL;
	}

	separator = L',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_wcs(a, &ap->name, &wname);
			if (r == 0 && wname != NULL)
				length += wcslen(wname);
			else if (r < 0 && errno == ENOMEM)
				return (NULL);
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (NULL);

	/* Now, allocate the string and actually populate it. */
	wp = acl->acl_text_w = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL)
		return (NULL);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		ap = acl->acl_head;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, NULL, ap->tag, wname,
					    ap->permset, id);
					count++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = L"default:";
		else
			prefix = NULL;
		ap = acl->acl_head;
		count = 0;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					if (count > 0)
						*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, prefix, ap->tag,
					    wname, ap->permset, id);
					count ++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}

	return (acl->acl_text_w);
}